

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::emitShape(SemanticParser *this,SP *shape)

{
  int iVar1;
  mapped_type *pmVar2;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SP SVar4;
  
  iVar1 = std::__cxx11::string::compare((char *)(*in_RDX + 0x38));
  if (iVar1 == 0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    SVar4 = emitPlyMesh(this,shape);
    _Var3 = SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)(*in_RDX + 0x38));
    if (iVar1 == 0) {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      SVar4 = emitTriangleMesh(this,shape);
      _Var3 = SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)(*in_RDX + 0x38));
      if (iVar1 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        SVar4 = emitCurve(this,shape);
        _Var3 = SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)(*in_RDX + 0x38));
        if (iVar1 == 0) {
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          SVar4 = emitSphere(this,shape);
          _Var3 = SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)(*in_RDX + 0x38));
          if (iVar1 != 0) {
            pmVar2 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                   *)(shape + 0xb),(key_type *)(*in_RDX + 0x38));
            *pmVar2 = *pmVar2 + 1;
            (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            _Var3._M_pi = extraout_RDX;
            goto LAB_0013cbfa;
          }
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          SVar4 = emitDisk(this,shape);
          _Var3 = SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        }
      }
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var3._M_pi = extraout_RDX_00;
  }
LAB_0013cbfa:
  SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitShape(pbrt::syntactic::Shape::SP shape)
  {
    if (shape->type == "plymesh") 
      return emitPlyMesh(shape);
    if (shape->type == "trianglemesh")
      return emitTriangleMesh(shape);
    if (shape->type == "curve")
      return emitCurve(shape);
    if (shape->type == "sphere")
      return emitSphere(shape);
    if (shape->type == "disk")
      return emitDisk(shape);

    // throw std::runtime_error("un-handled shape "+shape->type);
    unhandledShapeTypeCounter[shape->type]++;
    // std::cout << "WARNING: un-handled shape " << shape->type << std::endl;
    return Shape::SP();
  }